

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O2

void PrintBlock(InstructionVMGraphContext *ctx,VmBlock *block)

{
  VmInstructionType VVar1;
  VmBlock *pVVar2;
  VmInstruction *pVVar3;
  char *pcVar4;
  VmBlock **ppVVar5;
  VmInstruction **ppVVar6;
  byte *pbVar7;
  VmValue **ppVVar8;
  ulong uVar9;
  uint i;
  uint uVar10;
  uint uVar11;
  uint i_6;
  char *pcVar12;
  VmValue *pVVar13;
  
  PrintUsers(ctx,&block->super_VmValue,false);
  pcVar12 = (block->name).begin;
  PrintLine(ctx,"%.*s.b%d:",(ulong)(uint)(*(int *)&(block->name).end - (int)pcVar12),pcVar12,
            (ulong)block->uniqueId);
  ctx->depth = ctx->depth + 1;
  Print(ctx,"  // predecessor blocks: [");
  for (uVar10 = 0; uVar10 < (block->predecessors).count; uVar10 = uVar10 + 1) {
    ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](&block->predecessors,uVar10);
    pVVar2 = *ppVVar5;
    if (uVar10 != 0) {
      Print(ctx,", ");
    }
    pcVar12 = (pVVar2->name).begin;
    Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar12),pcVar12,
          (ulong)pVVar2->uniqueId);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // successor blocks: [");
  for (uVar10 = 0; uVar10 < (block->successors).count; uVar10 = uVar10 + 1) {
    ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](&block->successors,uVar10);
    pVVar2 = *ppVVar5;
    if (uVar10 != 0) {
      Print(ctx,", ");
    }
    pcVar12 = (pVVar2->name).begin;
    Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar12),pcVar12,
          (ulong)pVVar2->uniqueId);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // immediate dominator: [");
  pVVar2 = block->idom;
  if (pVVar2 != (VmBlock *)0x0) {
    pcVar12 = (pVVar2->name).begin;
    Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar12),pcVar12,
          (ulong)pVVar2->uniqueId);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // dominance frontier: [");
  for (uVar10 = 0; uVar10 < (block->dominanceFrontier).count; uVar10 = uVar10 + 1) {
    ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](&block->dominanceFrontier,uVar10);
    pVVar2 = *ppVVar5;
    if (uVar10 != 0) {
      Print(ctx,", ");
    }
    pcVar12 = (pVVar2->name).begin;
    Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar12),pcVar12,
          (ulong)pVVar2->uniqueId);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // dominance children: [");
  for (uVar10 = 0; uVar10 < (block->dominanceChildren).count; uVar10 = uVar10 + 1) {
    ppVVar5 = SmallArray<VmBlock_*,_4U>::operator[](&block->dominanceChildren,uVar10);
    pVVar2 = *ppVVar5;
    if (uVar10 != 0) {
      Print(ctx,", ");
    }
    pcVar12 = (pVVar2->name).begin;
    Print(ctx,"\'%.*s.b%d\'",(ulong)(uint)(*(int *)&(pVVar2->name).end - (int)pcVar12),pcVar12,
          (ulong)pVVar2->uniqueId);
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // live variables going in: [");
  for (uVar10 = 0; uVar10 < (block->liveIn).count; uVar10 = uVar10 + 1) {
    ppVVar6 = SmallArray<VmInstruction_*,_4U>::operator[](&block->liveIn,uVar10);
    pVVar3 = *ppVVar6;
    if (uVar10 != 0) {
      Print(ctx,", ");
    }
    VVar1 = pVVar3->cmd;
    Print(ctx,"%%%d",(ulong)pVVar3->uniqueId);
    if (VVar1 == VM_INST_PHI) {
      if (pVVar3->color != 0) {
        Print(ctx,".c%d");
      }
      if ((pVVar3->regVmRegisters).count != 0) {
        Print(ctx,".r");
        for (uVar11 = 0; uVar11 < (pVVar3->regVmRegisters).count; uVar11 = uVar11 + 1) {
          pcVar12 = "|%d";
          if (uVar11 == 0) {
            pcVar12 = "%d";
          }
          pbVar7 = SmallArray<unsigned_char,_8U>::operator[](&pVVar3->regVmRegisters,uVar11);
          Print(ctx,pcVar12,(ulong)*pbVar7);
        }
      }
      pcVar12 = (pVVar3->super_VmValue).comment.begin;
      pcVar4 = (pVVar3->super_VmValue).comment.end;
      if (pcVar12 == pcVar4) {
        Print(ctx," [");
      }
      else {
        Print(ctx," (%.*s) [",(ulong)(uint)((int)pcVar4 - (int)pcVar12));
      }
      for (uVar11 = 0; uVar11 < (pVVar3->arguments).count; uVar11 = uVar11 + 2) {
        ppVVar8 = SmallArray<VmValue_*,_4U>::operator[](&pVVar3->arguments,uVar11);
        pVVar13 = *ppVVar8;
        if ((pVVar13 == (VmValue *)0x0) || (pVVar13->typeID != 2)) {
          pVVar13 = (VmValue *)0x0;
        }
        if (uVar11 != 0) {
          Print(ctx,", ");
        }
        pcVar12 = (pVVar13->comment).begin;
        pcVar4 = (pVVar13->comment).end;
        uVar9 = (ulong)*(uint *)((long)&pVVar13[1]._vptr_VmValue + 4);
        if (pcVar12 == pcVar4) {
          Print(ctx,"%%%d",uVar9);
        }
        else {
          Print(ctx,"%%%d (%.*s)",uVar9,(ulong)(uint)((int)pcVar4 - (int)pcVar12));
        }
      }
      Print(ctx,"]");
    }
    else {
      if (pVVar3->color != 0) {
        Print(ctx,".c%d");
      }
      if ((pVVar3->regVmRegisters).count != 0) {
        Print(ctx,".r");
        for (uVar11 = 0; uVar11 < (pVVar3->regVmRegisters).count; uVar11 = uVar11 + 1) {
          pcVar12 = "|%d";
          if (uVar11 == 0) {
            pcVar12 = "%d";
          }
          pbVar7 = SmallArray<unsigned_char,_8U>::operator[](&pVVar3->regVmRegisters,uVar11);
          Print(ctx,pcVar12,(ulong)*pbVar7);
        }
      }
      pcVar12 = (pVVar3->super_VmValue).comment.begin;
      pcVar4 = (pVVar3->super_VmValue).comment.end;
      if (pcVar12 != pcVar4) {
        Print(ctx," (%.*s)",(ulong)(uint)((int)pcVar4 - (int)pcVar12));
      }
    }
  }
  PrintLine(ctx,"]");
  Print(ctx,"  // live variables going out: [");
  for (uVar10 = 0; uVar10 < (block->liveOut).count; uVar10 = uVar10 + 1) {
    ppVVar6 = SmallArray<VmInstruction_*,_4U>::operator[](&block->liveOut,uVar10);
    pVVar3 = *ppVVar6;
    if (uVar10 != 0) {
      Print(ctx,", ");
    }
    Print(ctx,"%%%d",(ulong)pVVar3->uniqueId);
    if (pVVar3->color != 0) {
      Print(ctx,".c%d");
    }
    if ((pVVar3->regVmRegisters).count != 0) {
      Print(ctx,".r");
      for (uVar11 = 0; uVar11 < (pVVar3->regVmRegisters).count; uVar11 = uVar11 + 1) {
        pcVar12 = "|%d";
        if (uVar11 == 0) {
          pcVar12 = "%d";
        }
        pbVar7 = SmallArray<unsigned_char,_8U>::operator[](&pVVar3->regVmRegisters,uVar11);
        Print(ctx,pcVar12,(ulong)*pbVar7);
      }
    }
    pcVar12 = (pVVar3->super_VmValue).comment.begin;
    pcVar4 = (pVVar3->super_VmValue).comment.end;
    if (pcVar12 != pcVar4) {
      Print(ctx," (%.*s)",(ulong)(uint)((int)pcVar4 - (int)pcVar12));
    }
  }
  PrintLine(ctx,"]");
  ppVVar6 = &block->firstInstruction;
  while (pVVar3 = *ppVVar6, pVVar3 != (VmInstruction *)0x0) {
    if ((ctx->displayAsTree != true) || ((pVVar3->super_VmValue).users.count == 0)) {
      PrintIndent(ctx);
      PrintInstruction(ctx,pVVar3);
    }
    ppVVar6 = &pVVar3->nextSibling;
  }
  ctx->depth = ctx->depth - 1;
  PrintLine(ctx);
  return;
}

Assistant:

void PrintBlock(InstructionVMGraphContext &ctx, VmBlock *block)
{
	PrintUsers(ctx, block, false);

	PrintLine(ctx, "%.*s.b%d:", FMT_ISTR(block->name), block->uniqueId);

	ctx.depth++;

	Print(ctx, "  // predecessor blocks: [");

	for(unsigned i = 0; i < block->predecessors.size(); i++)
	{
		VmBlock *predecessor = block->predecessors[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(predecessor->name), predecessor->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // successor blocks: [");

	for(unsigned i = 0; i < block->successors.size(); i++)
	{
		VmBlock *successor = block->successors[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(successor->name), successor->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // immediate dominator: [");

	if(block->idom)
		Print(ctx, "'%.*s.b%d'", FMT_ISTR(block->idom->name), block->idom->uniqueId);

	PrintLine(ctx, "]");

	Print(ctx, "  // dominance frontier: [");

	for(unsigned i = 0; i < block->dominanceFrontier.size(); i++)
	{
		VmBlock *dominator = block->dominanceFrontier[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(dominator->name), dominator->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // dominance children: [");

	for(unsigned i = 0; i < block->dominanceChildren.size(); i++)
	{
		VmBlock *dominator = block->dominanceChildren[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "'%.*s.b%d'", FMT_ISTR(dominator->name), dominator->uniqueId);
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // live variables going in: [");

	for(unsigned i = 0; i < block->liveIn.size(); i++)
	{
		VmInstruction *liveIn = block->liveIn[i];

		if(i != 0)
			Print(ctx, ", ");

		if(liveIn->cmd == VM_INST_PHI)
		{
			Print(ctx, "%%%d", liveIn->uniqueId);

			if(liveIn->color)
				Print(ctx, ".c%d", liveIn->color);

			if(!liveIn->regVmRegisters.empty())
			{
				Print(ctx, ".r");

				for(unsigned i = 0; i < liveIn->regVmRegisters.size(); i++)
					Print(ctx, i == 0 ? "%d" : "|%d", liveIn->regVmRegisters[i]);
			}

			if(liveIn->comment.empty())
				Print(ctx, " [");
			else
				Print(ctx, " (%.*s) [", FMT_ISTR(liveIn->comment));

			for(unsigned k = 0; k < liveIn->arguments.size(); k += 2)
			{
				VmInstruction *value = getType<VmInstruction>(liveIn->arguments[k]);

				if(k != 0)
					Print(ctx, ", ");

				if(value->comment.empty())
					Print(ctx, "%%%d", value->uniqueId);
				else
					Print(ctx, "%%%d (%.*s)", value->uniqueId, FMT_ISTR(value->comment));
			}

			Print(ctx, "]");
		}
		else
		{
			Print(ctx, "%%%d", liveIn->uniqueId);

			if(liveIn->color)
				Print(ctx, ".c%d", liveIn->color);

			if(!liveIn->regVmRegisters.empty())
			{
				Print(ctx, ".r");

				for(unsigned i = 0; i < liveIn->regVmRegisters.size(); i++)
					Print(ctx, i == 0 ? "%d" : "|%d", liveIn->regVmRegisters[i]);
			}

			if(!liveIn->comment.empty())
				Print(ctx, " (%.*s)", FMT_ISTR(liveIn->comment));
		}
	}

	PrintLine(ctx, "]");

	Print(ctx, "  // live variables going out: [");

	for(unsigned i = 0; i < block->liveOut.size(); i++)
	{
		VmInstruction *liveOut = block->liveOut[i];

		if(i != 0)
			Print(ctx, ", ");

		Print(ctx, "%%%d", liveOut->uniqueId);

		if(liveOut->color)
			Print(ctx, ".c%d", liveOut->color);

		if(!liveOut->regVmRegisters.empty())
		{
			Print(ctx, ".r");

			for(unsigned i = 0; i < liveOut->regVmRegisters.size(); i++)
				Print(ctx, i == 0 ? "%d" : "|%d", liveOut->regVmRegisters[i]);
		}

		if(!liveOut->comment.empty())
			Print(ctx, " (%.*s)", FMT_ISTR(liveOut->comment));
	}

	PrintLine(ctx, "]");

	for(VmInstruction *value = block->firstInstruction; value; value = value->nextSibling)
	{
		if(ctx.displayAsTree && !value->users.empty())
			continue;

		PrintIndent(ctx);
		PrintInstruction(ctx, value);
	}

	ctx.depth--;

	PrintLine(ctx);
}